

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferActiveUniformValidation::initTest(TextureBufferActiveUniformValidation *this)

{
  GLenum GVar1;
  code *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  deUint32 dVar6;
  GLuint GVar7;
  GLenum GVar8;
  NotSupportedError *this_00;
  size_type sVar9;
  ulong uVar10;
  GLuint *pGVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  reference pvVar14;
  uint local_2c;
  GLuint i;
  Functions *gl;
  TextureBufferActiveUniformValidation *this_local;
  long lVar13;
  
  if (((this->super_TestCaseBase).m_is_texture_buffer_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture buffer functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
               ,0x69);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  sVar9 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                    (&this->m_texture_params);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar9;
  uVar10 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pGVar11 = (GLuint *)operator_new__(uVar10);
  this->m_tbo_tex_ids = pGVar11;
  sVar9 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                    (&this->m_texture_params);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar9;
  uVar10 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pGVar11 = (GLuint *)operator_new__(uVar10);
  this->m_tbo_ids = pGVar11;
  pGVar11 = this->m_tbo_tex_ids;
  sVar9 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                    (&this->m_texture_params);
  memset(pGVar11,0,sVar9 << 2);
  pGVar11 = this->m_tbo_ids;
  sVar9 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                    (&this->m_texture_params);
  memset(pGVar11,0,sVar9 << 2);
  pRVar12 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar5 = (*pRVar12->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar5);
  local_2c = 0;
  while( true ) {
    sVar9 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                      (&this->m_texture_params);
    if (sVar9 <= local_2c) break;
    (**(code **)(lVar13 + 0x6c8))(1,this->m_tbo_ids + local_2c);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error generating buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x7c);
    (**(code **)(lVar13 + 0x40))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_ids[local_2c]);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error binding buffer object !",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x7e);
    pcVar2 = *(code **)(lVar13 + 0x150);
    GVar1 = (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER;
    pvVar14 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::
              operator[](&this->m_texture_params,(ulong)local_2c);
    GVar7 = TextureParameters::get_texture_buffer_size(pvVar14);
    (*pcVar2)(GVar1,GVar7,0,0x88e8);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error allocating buffer object\'s data store!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x80);
    (**(code **)(lVar13 + 0x6f8))(1,this->m_tbo_tex_ids + local_2c);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error generating texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x84);
    (**(code **)(lVar13 + 8))(local_2c + 0x84c0);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error activating texture unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x86);
    (**(code **)(lVar13 + 0xb8))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_ids[local_2c]
              );
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error binding texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x88);
    pcVar2 = *(code **)(lVar13 + 0x12f8);
    GVar1 = (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER;
    pvVar14 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::
              operator[](&this->m_texture_params,(ulong)local_2c);
    GVar8 = TextureParameters::get_texture_format(pvVar14);
    (*pcVar2)(GVar1,GVar8,this->m_tbo_ids[local_2c]);
    dVar6 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar6,"Error setting buffer object as data store for texture buffer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x8a);
    local_2c = local_2c + 1;
  }
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])();
  return;
}

Assistant:

void TextureBufferActiveUniformValidation::initTest(void)
{
	/* Check if required extensions are supported */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Call specific implementation to configure texture params */
	configureParams(&m_texture_params);

	m_tbo_tex_ids = new glw::GLuint[m_texture_params.size()];
	m_tbo_ids	 = new glw::GLuint[m_texture_params.size()];

	memset(m_tbo_tex_ids, 0, m_texture_params.size() * sizeof(glw::GLuint));
	memset(m_tbo_ids, 0, m_texture_params.size() * sizeof(glw::GLuint));

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create buffers and textures */
	for (glw::GLuint i = 0; i < m_texture_params.size(); ++i)
	{
		/* Create buffer object*/
		gl.genBuffers(1, &m_tbo_ids[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
		gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_ids[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object !");
		gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_texture_params[i].get_texture_buffer_size(), 0, GL_DYNAMIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

		/* Create texture buffer */
		gl.genTextures(1, &m_tbo_tex_ids[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");
		gl.activeTexture(GL_TEXTURE0 + i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error activating texture unit!");
		gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_ids[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");
		gl.texBuffer(m_glExtTokens.TEXTURE_BUFFER, m_texture_params[i].get_texture_format(), m_tbo_ids[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting buffer object as data store for texture buffer!");
	}

	/* Create program */
	createProgram();
}